

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rudp.hpp
# Opt level: O1

void __thiscall rudp::rudp_server::disconnect(rudp_server *this,uint32_t session_id)

{
  _Rb_tree_header *p_Var1;
  _Base_ptr p_Var2;
  iterator iVar3;
  _Base_ptr p_Var4;
  bool bVar5;
  
  p_Var1 = &(this->session_bindings)._M_t._M_impl.super__Rb_tree_header;
  p_Var2 = (this->session_bindings)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
  p_Var4 = &p_Var1->_M_header;
  for (; p_Var2 != (_Base_ptr)0x0; p_Var2 = (&p_Var2->_M_left)[bVar5]) {
    bVar5 = p_Var2[1]._M_color < session_id;
    if (!bVar5) {
      p_Var4 = p_Var2;
    }
  }
  p_Var2 = &p_Var1->_M_header;
  if (((_Rb_tree_header *)p_Var4 != p_Var1) && (p_Var2 = p_Var4, session_id < p_Var4[1]._M_color)) {
    p_Var2 = &p_Var1->_M_header;
  }
  if ((((_Rb_tree_header *)p_Var2 != p_Var1) &&
      (iVar3 = std::
               _Rb_tree<boost::asio::ip::basic_endpoint<boost::asio::ip::udp>,_std::pair<const_boost::asio::ip::basic_endpoint<boost::asio::ip::udp>,_std::shared_ptr<rudp::session>_>,_std::_Select1st<std::pair<const_boost::asio::ip::basic_endpoint<boost::asio::ip::udp>,_std::shared_ptr<rudp::session>_>_>,_std::less<boost::asio::ip::basic_endpoint<boost::asio::ip::udp>_>,_std::allocator<std::pair<const_boost::asio::ip::basic_endpoint<boost::asio::ip::udp>,_std::shared_ptr<rudp::session>_>_>_>
               ::find(&(this->sessions)._M_t,(key_type *)&p_Var2[1].field_0x4),
      (_Rb_tree_header *)iVar3._M_node != &(this->sessions)._M_t._M_impl.super__Rb_tree_header)) &&
     (*(session **)(iVar3._M_node + 2) != (session *)0x0)) {
    session::disconnect(*(session **)(iVar3._M_node + 2));
    return;
  }
  return;
}

Assistant:

void disconnect( uint32_t session_id ) {
    auto endpoint = session_bindings.find( session_id );
    if( endpoint != session_bindings.end() ) {
      auto sess = sessions.find( endpoint->second );
      if( sess != sessions.end() && sess->second )
        sess->second->disconnect();
    }
  }